

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

_Bool ggml_backend_cpu_buffer_cpy_tensor
                (ggml_backend_buffer_t buffer,ggml_tensor *src,ggml_tensor *dst)

{
  void *__dest;
  void *__src;
  _Bool _Var1;
  size_t __n;
  long in_RDX;
  ggml_tensor *in_RSI;
  
  _Var1 = ggml_backend_buffer_is_host((ggml_backend_buffer_t)0x164c51);
  if (_Var1) {
    __dest = *(void **)(in_RDX + 0xf8);
    __src = in_RSI->data;
    __n = ggml_nbytes(in_RSI);
    memcpy(__dest,__src,__n);
  }
  return _Var1;
}

Assistant:

static bool ggml_backend_cpu_buffer_cpy_tensor(ggml_backend_buffer_t buffer, const struct ggml_tensor * src, struct ggml_tensor * dst) {
    if (ggml_backend_buffer_is_host(src->buffer)) {
        memcpy(dst->data, src->data, ggml_nbytes(src));
        return true;
    }
    return false;

    GGML_UNUSED(buffer);
}